

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall cs_impl::any::make<cs::pointer,cs_impl::any_const&>(any *this,any *args)

{
  baseHolder *pbVar1;
  proxy *ppVar2;
  any local_20;
  
  if ((DAT_00333db8 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x10);
  }
  else {
    pbVar1 = *(baseHolder **)(&holder<cs::structure>::allocator + DAT_00333db8 * 8);
    DAT_00333db8 = DAT_00333db8 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__holder_003239b0;
  ppVar2 = args->mDat;
  if (ppVar2 != (proxy *)0x0) {
    ppVar2->refcount = ppVar2->refcount + 1;
  }
  pbVar1[1]._vptr_baseHolder = (_func_int **)ppVar2;
  local_20.mDat = (proxy *)0x0;
  recycle(&local_20);
  if ((DAT_00339e90 == 0) || (cs::global_thread_counter != 0)) {
    ppVar2 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar2 = (proxy *)(&cs::null_pointer)[DAT_00339e90];
    DAT_00339e90 = DAT_00339e90 + -1;
  }
  ppVar2->is_rvalue = false;
  ppVar2->protect_level = 0;
  ppVar2->refcount = 1;
  ppVar2->data = pbVar1;
  this->mDat = ppVar2;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}